

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O3

mraa_boolean_t mraa_link_targets(char *filename,char *targetname)

{
  bool bVar1;
  uint uVar2;
  char *__buf;
  ssize_t sVar3;
  char *pcVar4;
  int iVar5;
  
  iVar5 = 100;
  pcVar4 = (char *)0x0;
  while( true ) {
    __buf = (char *)realloc(pcVar4,(long)iVar5);
    if (__buf == (char *)0x0) break;
    sVar3 = readlink(filename,__buf,(long)iVar5);
    uVar2 = (uint)sVar3;
    pcVar4 = __buf;
    if ((int)uVar2 < 0) break;
    __buf[uVar2 & 0x7fffffff] = '\0';
    bVar1 = iVar5 <= (int)uVar2;
    iVar5 = iVar5 << bVar1;
    if (uVar2 != 0 && !bVar1) {
      pcVar4 = strstr(__buf,targetname);
      free(__buf);
      return (uint)(pcVar4 != (char *)0x0);
    }
  }
  free(pcVar4);
  return 0;
}

Assistant:

mraa_boolean_t
mraa_link_targets(const char* filename, const char* targetname)
{
    int size = 100;
    int nchars = 0;
    char* buffer = NULL;
    while (nchars == 0) {
        char* old_buffer = buffer;
        buffer = (char*) realloc(buffer, size);
        if (buffer == NULL) {
            free(old_buffer);
            return 0;
        }
        nchars = readlink(filename, buffer, size);
        if (nchars < 0) {
            free(buffer);
            return 0;
        } else {
            buffer[nchars] = '\0';
        }
        if (nchars >= size) {
            size *= 2;
            nchars = 0;
        }
    }
    if (strstr(buffer, targetname)) {
        free(buffer);
        return 1;
    } else {
        free(buffer);
        return 0;
    }
}